

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

mmkuser_malloc_mock_returntype mmkuser_malloc_mock_stub(size_t param0)

{
  mmk_matcher_kind mVar1;
  mmk_matcher *pmVar2;
  ulong uVar3;
  void *pvVar4;
  mmk_va_info *pmVar5;
  int iVar6;
  mmk_matcher *pmVar7;
  mmk_stub_conflict stub;
  mmk_mock_ctx *mock;
  void *data;
  mmk_result *pmVar8;
  mmk_params *pmVar9;
  int *piVar10;
  mmk_params *pmVar11;
  long *prev;
  _func_void *p_Var12;
  size_t t;
  mmkuser_malloc_mock_binding *bind;
  mmk_matcher *unaff_R15;
  bool bVar13;
  undefined8 uStack_58;
  mmkuser_malloc_mock_params reg_params;
  
  pmVar7 = mmk_matcher_ctx();
  if (pmVar7 == (mmk_matcher *)0x0) {
    reg_params.mmk_va_args_sz__ = 0;
    uStack_58 = 0;
    reg_params.mmk_times__ = 0;
    reg_params.mmk_va_args__ = (mmk_va_param **)param0;
    mmk_verify_register_call(&uStack_58,0x20);
    for (pmVar9 = mmk_mock_get_params(); pmVar9 != (mmk_params *)0x0; pmVar9 = pmVar9->next) {
      pmVar7 = pmVar9->matcher_ctx->next;
      if (pmVar7 == (mmk_matcher *)0x0) {
        bVar13 = true;
        if (pmVar9[4].next != (mmk_params *)param0) goto LAB_00102644;
LAB_001025c7:
        iVar6 = *(int *)((long)&pmVar9[1].matcher_ctx + 4);
        if (iVar6 != 0) {
          piVar10 = __errno_location();
          *piVar10 = iVar6;
        }
        pmVar7 = pmVar9[2].matcher_ctx;
        if (pmVar7 == (mmk_matcher *)0x0) {
LAB_001025ff:
          pmVar11 = pmVar9[1].next;
          if (pmVar11 == (mmk_params *)0x0) {
            bVar13 = false;
            unaff_R15 = (mmk_matcher *)0x0;
            goto LAB_00102644;
          }
LAB_00102608:
          unaff_R15 = pmVar11->matcher_ctx;
        }
        else {
          if (pmVar9[1].next != (mmk_params *)0x0) {
            if ((pmVar7 == (mmk_matcher *)0x0) || (pmVar9[1].next == (mmk_params *)0x0))
            goto LAB_001025ff;
            (*(code *)pmVar7)(param0);
            pmVar11 = pmVar9[1].next;
            goto LAB_00102608;
          }
          unaff_R15 = (mmk_matcher *)(*(code *)pmVar7)(param0);
        }
        bVar13 = false;
      }
      else {
        mVar1 = pmVar7->kind;
        if (mVar1 == MMK_MATCHER_ANY) goto LAB_001025c7;
        if ((mVar1 >> 0x1e & 1) == 0) {
          if (mVar1 == MMK_MATCHER_THAT) {
            p_Var12 = mmk_matcher_get_predicate(pmVar7);
            iVar6 = (*p_Var12)(param0);
            bVar13 = iVar6 == 0;
            if (bVar13) goto LAB_00102644;
          }
          goto LAB_001025c7;
        }
        pmVar11 = pmVar9[4].next;
        bVar13 = true;
        if (((((mVar1 & 2) != MMK_MATCHER_ANY) || (pmVar11 != (mmk_params *)param0)) &&
            (((mVar1 & 4) != MMK_MATCHER_ANY || (pmVar11 <= param0)))) &&
           (((mVar1 & 8) != MMK_MATCHER_ANY || (param0 <= pmVar11)))) goto LAB_001025c7;
      }
LAB_00102644:
      if (!bVar13) {
        return unaff_R15;
      }
    }
  }
  else {
    stub = mmk_ctx();
    mock = (mmk_mock_ctx *)mmk_stub_context(stub);
    mmk_mock_report_call();
    if (pmVar7->kind == MMK_MATCHER_THAT) {
      prev = (long *)mmk_mock_params_begin(mock);
      if (prev == (long *)0x0) {
        t = 0;
      }
      else {
        t = 0;
        do {
          pmVar2 = pmVar7->next;
          if (pmVar2 == (mmk_matcher *)0x0) {
            if (prev[3] != param0) goto LAB_001026a6;
LAB_001026a2:
            t = t + *prev;
          }
          else {
            mVar1 = pmVar2->kind;
            if (mVar1 == MMK_MATCHER_ANY) goto LAB_001026a2;
            if ((mVar1 >> 0x1e & 1) == 0) {
              if (mVar1 == MMK_MATCHER_THAT) {
                p_Var12 = mmk_matcher_get_predicate(pmVar2);
                iVar6 = (*p_Var12)(prev[3]);
                if (iVar6 == 0) goto LAB_001026a6;
              }
              goto LAB_001026a2;
            }
            uVar3 = prev[3];
            if (((((mVar1 & 2) != MMK_MATCHER_ANY) || (uVar3 != param0)) &&
                (((mVar1 & 4) != MMK_MATCHER_ANY || (param0 <= uVar3)))) &&
               (((mVar1 & 8) != MMK_MATCHER_ANY || (uVar3 <= param0)))) goto LAB_001026a2;
          }
LAB_001026a6:
          prev = (long *)mmk_mock_params_next(mock,prev);
        } while (prev != (long *)0x0);
      }
      do {
        pmVar2 = pmVar7->next;
        mmk_free(pmVar7);
        pmVar7 = pmVar2;
      } while (pmVar2 != (mmk_matcher *)0x0);
      mmk_verify_set_times(t);
    }
    else if (pmVar7->kind == MMK_MATCHER_ANY) {
      data = mmk_malloc(0x50);
      pmVar8 = mmk_when_get_result();
      pvVar4 = pmVar8->then_return;
      p_Var12 = pmVar8->then_call;
      pmVar5 = pmVar8->with_va;
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)pmVar8;
      *(void **)((long)data + 0x18) = pvVar4;
      *(_func_void **)((long)data + 0x20) = p_Var12;
      *(mmk_va_info **)((long)data + 0x28) = pmVar5;
      *(size_t *)((long)data + 0x48) = param0;
      mmk_when_impl(mock,data);
    }
  }
  return (mmkuser_malloc_mock_returntype)0x0;
}

Assistant:

void test_simple_case(void)
{
    static char ref[] = "hello";
    char buf[sizeof (ref)];

    malloc_mock m = mmk_mock("malloc@lib:strdup", malloc_mock);
    mmk_assert((mmk_fn) m != MMK_MOCK_INVALID);

    mmk_when(malloc(sizeof(ref)), .then_return = &(char*) { buf });

    char *dup = my_strdup("hello");

    /* mmk_verify is overkill in this case, mmk_verify should be used when you
     * care about testing interactions rather than external behaviour */
    int pass = mmk_verify(malloc(mmk_ge(size_t, sizeof (ref))), .times = 1);

    mmk_assert(pass);
    mmk_assert(dup == buf && !strcmp(ref, buf));

    mmk_reset(malloc);
}